

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O0

void dasm_setup(BuildCtx *ctx,void *actionlist)

{
  long lVar1;
  undefined8 in_RSI;
  long *in_RDI;
  int i;
  dasm_State *D;
  undefined4 local_1c;
  
  lVar1 = *in_RDI;
  *(undefined8 *)(lVar1 + 8) = in_RSI;
  *(undefined4 *)(lVar1 + 0x4c) = 0;
  *(long *)(lVar1 + 0x38) = lVar1 + 0x50;
  memset(*(void **)(lVar1 + 0x10),0,*(size_t *)(lVar1 + 0x18));
  if (*(long *)(lVar1 + 0x20) != 0) {
    memset(*(void **)(lVar1 + 0x20),0,*(size_t *)(lVar1 + 0x28));
  }
  for (local_1c = 0; local_1c < *(int *)(lVar1 + 0x48); local_1c = local_1c + 1) {
    *(int *)(lVar1 + (long)local_1c * 0x28 + 0x68) = local_1c << 0x18;
    *(undefined4 *)(lVar1 + (long)local_1c * 0x28 + 0x70) = 0;
  }
  return;
}

Assistant:

void dasm_setup(Dst_DECL, const void *actionlist)
{
  dasm_State *D = Dst_REF;
  int i;
  D->actionlist = (dasm_ActList)actionlist;
  D->status = DASM_S_OK;
  D->section = &D->sections[0];
  memset((void *)D->lglabels, 0, D->lgsize);
  if (D->pclabels) memset((void *)D->pclabels, 0, D->pcsize);
  for (i = 0; i < D->maxsection; i++) {
    D->sections[i].pos = DASM_SEC2POS(i);
    D->sections[i].ofs = 0;
  }
}